

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

Argument * dg::vr::getArgument(ValueRelations *graph,Handle h)

{
  Relations *pRVar1;
  Argument *pAVar2;
  _Base_ptr p_Var3;
  Argument *pAVar4;
  _Base_bitset<1UL> local_58;
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  local_50;
  
  local_58._M_w = 0;
  pRVar1 = Relations::sle((Relations *)&local_58);
  pRVar1 = Relations::sge(pRVar1);
  ValueRelations::getRelated<dg::vr::Bucket>((RelationsMap *)&local_50,graph,h,pRVar1);
  pAVar4 = (Argument *)0x0;
  for (p_Var3 = local_50._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &local_50._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    pAVar2 = ValueRelations::getInstance<llvm::Argument>(graph,*(Handle *)(p_Var3 + 1));
    if (pAVar2 != (Argument *)0x0) {
      pAVar4 = pAVar2;
    }
  }
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::~_Rb_tree(&local_50);
  return pAVar4;
}

Assistant:

const llvm::Argument *getArgument(const ValueRelations &graph,
                                  ValueRelations::Handle h) {
    const llvm::Argument *result = nullptr;
    for (auto handleRel : graph.getRelated(h, Relations().sle().sge())) {
        const llvm::Argument *arg =
                graph.getInstance<llvm::Argument>(handleRel.first);
        if (arg) {
            assert(!result);
            result = arg;
        }
    }
    return result;
}